

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

bool IsArgumentVariable(FunctionData *function,VariableData *data)

{
  VariableHandle *local_28;
  VariableHandle *curr;
  VariableData *data_local;
  FunctionData *function_local;
  
  local_28 = (function->argumentVariables).head;
  while( true ) {
    if (local_28 == (VariableHandle *)0x0) {
      return data == function->contextArgument;
    }
    if (data == local_28->variable) break;
    local_28 = local_28->next;
  }
  return true;
}

Assistant:

bool IsArgumentVariable(FunctionData *function, VariableData *data)
{
	for(VariableHandle *curr = function->argumentVariables.head; curr; curr = curr->next)
	{
		if(data == curr->variable)
			return true;
	}

	if(data == function->contextArgument)
		return true;

	return false;
}